

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O3

Person * __thiscall Controller::findPersonByName(Controller *this,string *name)

{
  _Alloc_hider _Var1;
  int iVar2;
  ostream *poVar3;
  Person *pPVar4;
  _List_node_base *p_Var5;
  list<Person_*,_std::allocator<Person_*>_> *plVar6;
  bool bVar7;
  string local_50;
  
  p_Var5 = (this->players).super__List_base<Person_*,_std::allocator<Person_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  plVar6 = &this->players;
  if (p_Var5 != (_List_node_base *)plVar6) {
    do {
      Person::getName_abi_cxx11_(&local_50,(Person *)p_Var5[1]._M_next);
      _Var1._M_p = local_50._M_dataplus._M_p;
      if (local_50._M_string_length == name->_M_string_length) {
        if (local_50._M_string_length == 0) {
          bVar7 = true;
        }
        else {
          iVar2 = bcmp(local_50._M_dataplus._M_p,(name->_M_dataplus)._M_p,local_50._M_string_length)
          ;
          bVar7 = iVar2 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_50.field_2) {
        operator_delete(_Var1._M_p);
      }
    } while ((!bVar7) && (p_Var5 = p_Var5->_M_next, p_Var5 != (_List_node_base *)plVar6));
  }
  if (p_Var5 == (_List_node_base *)plVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"La personne ",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," n\'existe pas",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pPVar4 = (Person *)0x0;
  }
  else {
    pPVar4 = (Person *)p_Var5[1]._M_next;
  }
  return pPVar4;
}

Assistant:

Person* Controller::findPersonByName(const string& name) const {
    // Searches in the list of persons
    auto it = std::find_if(players.begin(), players.end(),
               [&name](const Person* p) {return p->getName() == name;});
    if (it == players.end()) {
        cout << "La personne " << name << " n'existe pas" << endl;
        return nullptr;
    }
    return *it;
}